

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O3

Elements * __thiscall
duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>::Allocate
          (MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL> *this,
          idx_t count)

{
  reference pvVar1;
  ulong uVar2;
  Offsets cascades;
  Elements elements;
  Elements lowest_level;
  vector<unsigned_long,_true> local_98;
  pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_> local_78;
  pointer local_48;
  pointer puStack_40;
  pointer local_38;
  
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,count,
             (allocator_type *)&local_78);
  local_78.first.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = local_48;
  local_78.first.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = puStack_40;
  local_78.first.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_38;
  local_48 = (pointer)0x0;
  puStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  local_78.second.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.second.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.second.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ::std::
  vector<std::pair<duckdb::vector<unsigned_long,true>,duckdb::vector<unsigned_long,true>>,std::allocator<std::pair<duckdb::vector<unsigned_long,true>,duckdb::vector<unsigned_long,true>>>>
  ::emplace_back<std::pair<duckdb::vector<unsigned_long,true>,duckdb::vector<unsigned_long,true>>>
            ((vector<std::pair<duckdb::vector<unsigned_long,true>,duckdb::vector<unsigned_long,true>>,std::allocator<std::pair<duckdb::vector<unsigned_long,true>,duckdb::vector<unsigned_long,true>>>>
              *)this,&local_78);
  if (local_78.second.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.second.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.first.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.first.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (1 < count) {
    uVar2 = 1;
    do {
      uVar2 = uVar2 * 0x20;
      local_78.first.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.first.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.first.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,count);
      local_98.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (0x20 < uVar2) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,
                   (uVar2 | 0x40) * ((uVar2 + (count - 1)) / uVar2));
      }
      ::std::
      vector<std::pair<duckdb::vector<unsigned_long,true>,duckdb::vector<unsigned_long,true>>,std::allocator<std::pair<duckdb::vector<unsigned_long,true>,duckdb::vector<unsigned_long,true>>>>
      ::emplace_back<duckdb::vector<unsigned_long,true>,duckdb::vector<unsigned_long,true>>
                ((vector<std::pair<duckdb::vector<unsigned_long,true>,duckdb::vector<unsigned_long,true>>,std::allocator<std::pair<duckdb::vector<unsigned_long,true>,duckdb::vector<unsigned_long,true>>>>
                  *)this,&local_78.first,&local_98);
      if (local_98.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_78.first.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.first.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    } while (uVar2 < count);
  }
  LOCK();
  (this->build_level).super___atomic_base<unsigned_long>._M_i = 1;
  UNLOCK();
  LOCK();
  (this->build_complete).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  this->build_run = 0;
  this->build_run_length = 0x20;
  this->build_num_runs = count + 0x1f >> 5;
  pvVar1 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
           ::operator[](&this->tree,0);
  if (local_48 != (pointer)0x0) {
    operator_delete(local_48);
  }
  return &pvVar1->first;
}

Assistant:

vector<E> &MergeSortTree<E, O, CMP, F, C>::Allocate(idx_t count) {
	const auto fanout = F;
	const auto cascading = C;
	Elements lowest_level(count);
	tree.emplace_back(Level(std::move(lowest_level), Offsets()));

	for (idx_t child_run_length = 1; child_run_length < count;) {
		const auto run_length = child_run_length * fanout;
		const auto num_runs = (count + run_length - 1) / run_length;

		Elements elements;
		elements.resize(count);

		//	Allocate cascading pointers only if there is room
		Offsets cascades;
		if (cascading > 0 && run_length > cascading) {
			const auto num_cascades = fanout * num_runs * (run_length / cascading + 2);
			cascades.resize(num_cascades);
		}

		//	Insert completed level and move up to the next one
		tree.emplace_back(std::move(elements), std::move(cascades));
		child_run_length = run_length;
	}

	//	Set up for parallel build
	build_level = 1;
	build_complete = 0;
	build_run = 0;
	build_run_length = fanout;
	build_num_runs = (count + build_run_length - 1) / build_run_length;

	return LowestLevel();
}